

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O1

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int ex;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long local_50;
  long local_48;
  ulong local_38;
  
  uVar1 = worker->y;
  uVar13 = uVar1 >> 8;
  iVar4 = (int)(uVar1 >> 8);
  iVar10 = (int)((ulong)to_y >> 8);
  if ((iVar10 < worker->max_ey || iVar4 < worker->max_ey) &&
     (worker->min_ey <= iVar4 || worker->min_ey <= iVar10)) {
    uVar2 = worker->x;
    uVar8 = uVar2 >> 8;
    iVar7 = (int)(uVar2 >> 8);
    local_38 = uVar2 + (long)iVar7 * -0x100;
    uVar11 = uVar1 + (long)iVar4 * -0x100;
    ex = (int)((ulong)to_x >> 8);
    if (iVar4 != iVar10 || iVar7 != ex) {
      if (to_y == uVar1) {
        gray_set_cell(worker,ex,iVar4);
      }
      else {
        lVar5 = to_y - uVar1;
        if (to_x == uVar2) {
          if (lVar5 < 1) {
            do {
              iVar4 = iVar4 + -1;
              worker->cover = worker->cover - (int)uVar11;
              worker->area = worker->area + (int)uVar11 * (int)local_38 * -2;
              gray_set_cell(worker,iVar7,iVar4);
              uVar11 = 0x100;
            } while (iVar4 != iVar10);
          }
          else {
            lVar5 = 0x100 - uVar11;
            uVar11 = 0;
            do {
              iVar4 = iVar4 + 1;
              worker->cover = worker->cover + (int)lVar5;
              worker->area = worker->area + (int)lVar5 * (int)local_38 * 2;
              gray_set_cell(worker,iVar7,iVar4);
              lVar5 = 0x100;
            } while (iVar4 != iVar10);
          }
        }
        else {
          lVar9 = to_x - uVar2;
          if (iVar7 == ex) {
            local_50 = 0;
          }
          else {
            local_50 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar9),0);
          }
          if (iVar4 == iVar10) {
            local_48 = 0;
          }
          else {
            local_48 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar5),0);
          }
          lVar6 = lVar5 * 0x100;
          lVar14 = lVar9 * uVar11 - local_38 * lVar5;
          do {
            lVar3 = lVar14 + lVar9 * -0x100;
            iVar4 = (int)uVar11;
            iVar7 = (int)local_38;
            if ((lVar3 == 0 || lVar14 < lVar9 * 0x100) || 0 < lVar14) {
              if ((lVar3 < 1) && (0 < lVar3 + lVar6)) {
                local_38 = -(local_48 * lVar3);
                worker->cover = worker->cover + (0x100 - iVar4);
                worker->area = worker->area +
                               (iVar7 + (uint)(byte)(local_38 >> 0x38)) * (0x100 - iVar4);
                uVar12 = (int)uVar13 + 1;
                uVar11 = 0;
              }
              else {
                if ((lVar3 + lVar6 == 0 || SCARRY8(lVar3,lVar6) != lVar3 + lVar6 < 0) &&
                   (lVar3 = lVar14 + lVar6, -1 < lVar3)) {
                  uVar11 = (ulong)(lVar3 * local_50) >> 0x38;
                  iVar4 = (uint)(byte)((ulong)(lVar3 * local_50) >> 0x38) - iVar4;
                  worker->cover = worker->cover + iVar4;
                  worker->area = worker->area + (iVar7 + 0x100) * iVar4;
                  uVar8 = (ulong)((int)uVar8 + 1);
                  local_38 = 0;
                  goto LAB_0022399c;
                }
                local_38 = -(local_48 * lVar14);
                worker->cover = worker->cover - iVar4;
                worker->area = worker->area - (iVar7 + (uint)(byte)(local_38 >> 0x38)) * iVar4;
                lVar3 = lVar14 + lVar9 * 0x100;
                uVar12 = (int)uVar13 - 1;
                uVar11 = 0x100;
              }
              local_38 = local_38 >> 0x38;
              uVar13 = (ulong)uVar12;
            }
            else {
              uVar11 = (ulong)(lVar14 * local_50) >> 0x38;
              iVar4 = (uint)(byte)((ulong)(lVar14 * local_50) >> 0x38) - iVar4;
              worker->cover = worker->cover + iVar4;
              worker->area = worker->area + iVar7 * iVar4;
              lVar3 = lVar14 + lVar5 * -0x100;
              uVar8 = (ulong)((int)uVar8 - 1);
              local_38 = 0x100;
            }
LAB_0022399c:
            gray_set_cell(worker,(int)uVar8,(int)uVar13);
            lVar14 = lVar3;
          } while (((int)uVar8 != ex) || ((int)uVar13 != iVar10));
        }
      }
    }
    iVar4 = (int)to_y - ((int)uVar11 + iVar10 * 0x100);
    worker->cover = worker->cover + iVar4;
    worker->area = worker->area + ((int)local_38 + ((uint)to_x & 0xff)) * iVar4;
  }
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void
  gray_render_line( RAS_ARG_ TPos  to_x,
                             TPos  to_y )
  {
    TPos    dx, dy, fx1, fy1, fx2, fy2;
    TCoord  ex1, ex2, ey1, ey2;


    ey1 = TRUNC( ras.y );
    ey2 = TRUNC( to_y );

    /* perform vertical clipping */
    if ( ( ey1 >= ras.max_ey && ey2 >= ras.max_ey ) ||
         ( ey1 <  ras.min_ey && ey2 <  ras.min_ey ) )
      goto End;

    ex1 = TRUNC( ras.x );
    ex2 = TRUNC( to_x );

    fx1 = ras.x - SUBPIXELS( ex1 );
    fy1 = ras.y - SUBPIXELS( ey1 );

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    if ( ex1 == ex2 && ey1 == ey2 )       /* inside one cell */
      ;
    else if ( dy == 0 ) /* ex1 != ex2 */  /* any horizontal line */
    {
      ex1 = ex2;
      gray_set_cell( RAS_VAR_ ex1, ey1 );
    }
    else if ( dx == 0 )
    {
      if ( dy > 0 )                       /* vertical line up */
        do
        {
          fy2 = ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * fx1 * 2;
          fy1 = 0;
          ey1++;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
      else                                /* vertical line down */
        do
        {
          fy2 = 0;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * fx1 * 2;
          fy1 = ONE_PIXEL;
          ey1--;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
    }
    else                                  /* any other line */
    {
      TPos  prod = dx * fy1 - dy * fx1;
      FT_UDIVPREP( ex1 != ex2, dx );
      FT_UDIVPREP( ey1 != ey2, dy );


      /* The fundamental value `prod' determines which side and the  */
      /* exact coordinate where the line exits current cell.  It is  */
      /* also easily updated when moving from one cell to the next.  */
      do
      {
        if      ( prod                                   <= 0 &&
                  prod - dx * ONE_PIXEL                  >  0 ) /* left */
        {
          fx2 = 0;
          fy2 = (TPos)FT_UDIV( -prod, -dx );
          prod -= dy * ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = ONE_PIXEL;
          fy1 = fy2;
          ex1--;
        }
        else if ( prod - dx * ONE_PIXEL                  <= 0 &&
                  prod - dx * ONE_PIXEL + dy * ONE_PIXEL >  0 ) /* up */
        {
          prod -= dx * ONE_PIXEL;
          fx2 = (TPos)FT_UDIV( -prod, dy );
          fy2 = ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = fx2;
          fy1 = 0;
          ey1++;
        }
        else if ( prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 &&
                  prod                  + dy * ONE_PIXEL >= 0 ) /* right */
        {
          prod += dy * ONE_PIXEL;
          fx2 = ONE_PIXEL;
          fy2 = (TPos)FT_UDIV( prod, dx );
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = 0;
          fy1 = fy2;
          ex1++;
        }
        else /* ( prod                  + dy * ONE_PIXEL <  0 &&
                  prod                                   >  0 )    down */
        {
          fx2 = (TPos)FT_UDIV( prod, -dy );
          fy2 = 0;
          prod += dx * ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = fx2;
          fy1 = ONE_PIXEL;
          ey1--;
        }

        gray_set_cell( RAS_VAR_ ex1, ey1 );
      } while ( ex1 != ex2 || ey1 != ey2 );
    }

    fx2 = to_x - SUBPIXELS( ex2 );
    fy2 = to_y - SUBPIXELS( ey2 );

    ras.cover += ( fy2 - fy1 );
    ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );

  End:
    ras.x       = to_x;
    ras.y       = to_y;
  }